

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::teximage2d_inequal_width_height_cube
               (NegativeTestContext *ctx)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if target is one of the six cube map 2D image targets and the width and height parameters are not equal."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8515,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8517,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8519,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8516,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8518,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x851a,0,0x1907,1,2,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void teximage2d_inequal_width_height_cube (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if target is one of the six cube map 2D image targets and the width and height parameters are not equal.");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 1, 2, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}